

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::TightenBoundsPS::TightenBoundsPS
          (TightenBoundsPS *this,SPxLPBase<double> *lp,int j,double origupper,double origlower,
          shared_ptr<soplex::Tolerances> *tols)

{
  int iVar1;
  shared_ptr<soplex::Tolerances> *in_RCX;
  undefined4 in_EDX;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  PostStep *in_stack_ffffffffffffffc0;
  
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            (in_RCX,(shared_ptr<soplex::Tolerances> *)
                    CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  iVar1 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2ce5ce);
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2ce5de);
  PostStep::PostStep(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                     (shared_ptr<soplex::Tolerances> *)CONCAT44(in_stack_ffffffffffffffb4,iVar1),
                     (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2ce60d);
  *in_RDI = &PTR__TightenBoundsPS_004ed430;
  *(undefined4 *)(in_RDI + 5) = in_EDX;
  in_RDI[6] = in_XMM0_Qa;
  in_RDI[7] = in_XMM1_Qa;
  return;
}

Assistant:

TightenBoundsPS(const SPxLPBase<R>& lp, int j, R origupper, R origlower,
                      std::shared_ptr<Tolerances> tols)
         : PostStep("TightenBounds", tols, lp.nRows(), lp.nCols())
         , m_j(j)
         , m_origupper(origupper)
         , m_origlower(origlower)
      {
      }